

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

void polymul_internal::taylor_inplace_multiplier<double,_2,_4,_6,_0>::mul(double *p1,double *p2)

{
  int iVar1;
  long lVar2;
  
  iVar1 = binomial(5,3);
  lVar2 = (long)iVar1;
  while( true ) {
    iVar1 = binomial(6,4);
    if (iVar1 <= lVar2) break;
    p1[lVar2] = *p2 * p1[lVar2];
    lVar2 = lVar2 + 1;
  }
  taylor_inplace_multiplier<double,_2,_4,_6,_1>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
         i < binomial(Nvar + Ndeg, Ndeg);
         i++)
      p1[i] *= p2[0];
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, 1>::mul(
        p1, p2); // continue at (2)
  }